

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  undefined4 uVar12;
  size_t sVar13;
  size_t sVar14;
  uint32_t *puVar15;
  uint32_t *puVar16;
  uint64_t uVar17;
  ulong uVar18;
  HasherCommon *pHVar19;
  uint8_t *puVar20;
  BrotliDictionary *pBVar21;
  void *pvVar22;
  undefined8 uVar23;
  bool bVar24;
  ulong uVar25;
  BrotliEncoderDictionary *pBVar26;
  undefined1 *puVar27;
  ushort uVar28;
  uint32_t uVar29;
  char *pcVar30;
  long lVar31;
  ulong *puVar32;
  long lVar33;
  char *pcVar34;
  byte bVar35;
  long lVar36;
  ulong uVar37;
  ulong *puVar38;
  char *pcVar39;
  uint uVar40;
  int iVar41;
  char *pcVar42;
  ulong *puVar43;
  ulong uVar44;
  BrotliEncoderDictionary *pBVar45;
  char *pcVar46;
  uint uVar47;
  char *pcVar48;
  ulong uVar49;
  undefined1 *puVar50;
  BrotliEncoderDictionary *pBVar51;
  ulong uVar52;
  BrotliEncoderDictionary *pBVar53;
  char *pcVar54;
  ulong *puVar55;
  uint uVar56;
  ulong *puVar57;
  BrotliEncoderDictionary *pBVar58;
  char *pcVar59;
  int iVar60;
  ulong uVar61;
  size_t sVar62;
  BrotliEncoderDictionary *pBVar63;
  undefined1 *puVar64;
  long lVar65;
  uint8_t *s1_orig_5;
  ulong uVar66;
  long lVar67;
  bool bVar68;
  uint32_t *buckets;
  char *local_188;
  ulong local_180;
  BrotliEncoderDictionary *local_158;
  ulong local_150;
  int local_144;
  size_t local_138;
  BrotliEncoderDictionary *local_130;
  char *local_120;
  int local_110;
  char *local_108;
  Command *local_e0;
  char *local_d0;
  ulong local_c0;
  uint local_b4;
  long local_68;
  uint8_t *s1_orig_4;
  int last_distance;
  
  iVar41 = params->lgwin;
  sVar13 = params->stream_offset;
  local_138 = *last_insert_len;
  pcVar30 = (char *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pcVar30 = (char *)position;
  }
  lVar36 = 0x200;
  if (params->quality < 9) {
    lVar36 = 0x40;
  }
  pcVar2 = (char *)(position + num_bytes);
  sVar14 = (params->dictionary).compound.total_size;
  iVar60 = (hasher->privat)._H6.num_last_distances_to_check_;
  if (4 < iVar60) {
    iVar9 = *dist_cache;
    dist_cache[4] = iVar9 + -1;
    dist_cache[5] = iVar9 + 1;
    dist_cache[6] = iVar9 + -2;
    dist_cache[7] = iVar9 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar9 + 3,iVar9 + -3);
    if (10 < iVar60) {
      iVar60 = dist_cache[1];
      dist_cache[10] = iVar60 + -1;
      dist_cache[0xb] = iVar60 + 1;
      dist_cache[0xc] = iVar60 + -2;
      dist_cache[0xd] = iVar60 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar60 + 3,iVar60 + -3);
    }
  }
  if ((char *)(position + 8) < pcVar2) {
    pcVar6 = (char *)((1L << ((byte)iVar41 & 0x3f)) - 0x10);
    local_d0 = (char *)(lVar36 + position);
    puVar15 = (hasher->privat)._H5.buckets_;
    puVar16 = (hasher->privat)._H6.buckets_;
    lVar31 = sVar14 + 1;
    pcVar1 = pcVar2 + 0xfffffffffffffff9;
    lVar5 = position - 1;
    local_e0 = commands;
    do {
      pcVar48 = pcVar6;
      if (position < pcVar6) {
        pcVar48 = (char *)position;
      }
      pcVar34 = (char *)(position + sVar13);
      if (pcVar6 <= (char *)(position + sVar13)) {
        pcVar34 = pcVar6;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_b4 = 0;
        local_c0 = 0;
      }
      else {
        if ((char *)position == (char *)0x0) {
          local_c0 = 0;
        }
        else {
          local_c0 = (ulong)ringbuffer[(ulong)(position + 0xffffffffffffffff) & ringbuffer_mask];
        }
        if (position < (char *)0x2) {
          uVar52 = 0;
        }
        else {
          uVar52 = (ulong)ringbuffer[(ulong)(position + 0xfffffffffffffffe) & ringbuffer_mask];
        }
        local_b4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar52 + 0x100] | literal_context_lut[local_c0]];
      }
      pBVar51 = (BrotliEncoderDictionary *)(pcVar2 + -position);
      pBVar63 = (params->dictionary).contextual.dict[local_b4];
      pcVar46 = (char *)(params->dist).max_distance;
      uVar61 = position & ringbuffer_mask;
      uVar52 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar52 == 0) {
        local_150 = 0x7e4;
        local_120 = (char *)0x0;
        local_130 = (BrotliEncoderDictionary *)0x0;
        pBVar45 = (BrotliEncoderDictionary *)0x0;
      }
      else {
        local_150 = 0x7e4;
        pBVar45 = (BrotliEncoderDictionary *)0x0;
        uVar66 = 0;
        local_130 = (BrotliEncoderDictionary *)0x0;
        local_120 = (char *)0x0;
        do {
          pcVar42 = (char *)(long)dist_cache[uVar66];
          if (((pcVar42 <= pcVar48) && ((char *)(position + -(long)pcVar42) < position)) &&
             (pcVar39 = (char *)((long)&pBVar45->words + uVar61), pcVar39 <= ringbuffer_mask)) {
            uVar37 = (ulong)(position + -(long)pcVar42) & ringbuffer_mask;
            pcVar54 = (char *)((long)&pBVar45->words + uVar37);
            if ((pcVar54 <= ringbuffer_mask) &&
               (ringbuffer[(long)pcVar39] == ringbuffer[(long)pcVar54])) {
              puVar38 = (ulong *)(ringbuffer + uVar37);
              pBVar58 = pBVar51;
              puVar32 = (ulong *)(ringbuffer + uVar61);
              puVar57 = puVar38;
              for (pBVar53 = pBVar51; (BrotliEncoderDictionary *)0x7 < pBVar53;
                  pBVar53 = (BrotliEncoderDictionary *)&pBVar53[-1].words_instance_) {
                uVar37 = *puVar32;
                uVar49 = *puVar57;
                if (uVar37 == uVar49) {
                  puVar57 = puVar57 + 1;
                }
                else {
                  uVar44 = 0;
                  if ((uVar49 ^ uVar37) != 0) {
                    for (; ((uVar49 ^ uVar37) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  pBVar58 = (BrotliEncoderDictionary *)
                            ((long)puVar57 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar38));
                }
                if (uVar37 != uVar49) goto LAB_01c21a49;
                puVar32 = puVar32 + 1;
              }
              if (pBVar53 != (BrotliEncoderDictionary *)0x0) {
                pBVar58 = (BrotliEncoderDictionary *)0x0;
                do {
                  pBVar26 = pBVar58;
                  if (*(char *)((long)puVar57 + (long)pBVar58) !=
                      *(char *)((long)puVar32 + (long)pBVar58)) break;
                  pBVar58 = (BrotliEncoderDictionary *)((long)&pBVar58->words + 1);
                  pBVar26 = pBVar53;
                } while (pBVar53 != pBVar58);
                puVar57 = (ulong *)((long)puVar57 + (long)pBVar26);
              }
              pBVar58 = (BrotliEncoderDictionary *)((long)puVar57 - (long)puVar38);
LAB_01c21a49:
              if ((((BrotliEncoderDictionary *)0x2 < pBVar58) ||
                  ((uVar66 < 2 && (pBVar58 == (BrotliEncoderDictionary *)0x2)))) &&
                 (uVar37 = (long)pBVar58 * 0x87 + 0x78f, local_150 < uVar37)) {
                if (uVar66 != 0) {
                  uVar37 = uVar37 - ((0x1ca10U >> ((byte)uVar66 & 0xe) & 0xe) + 0x27);
                }
                if (local_150 < uVar37) {
                  pBVar45 = pBVar58;
                  local_150 = uVar37;
                  local_130 = pBVar58;
                  local_120 = pcVar42;
                }
              }
            }
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 != uVar52);
      }
      uVar17 = (hasher->privat)._H6.hash_mul_;
      plVar3 = (long *)(ringbuffer + uVar61);
      uVar49 = *plVar3 * uVar17 >> 0x31;
      puVar32 = (ulong *)(ringbuffer + uVar61);
      uVar52 = (hasher->privat)._H5.block_size_;
      uVar8 = *(ushort *)((long)puVar15 + uVar49 * 2);
      uVar37 = (ulong)uVar8;
      uVar66 = 0;
      if (uVar52 <= uVar37) {
        uVar66 = uVar37 - uVar52;
      }
      pBVar53 = (BrotliEncoderDictionary *)
                (puVar16 + (uVar49 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f)));
      puVar27 = (undefined1 *)((long)&pBVar51[-1].words_instance_ + 4);
      do {
        uVar47 = (uint)ringbuffer_mask;
        if (uVar37 <= uVar66) break;
        uVar37 = uVar37 - 1;
        uVar40 = *(uint *)((long)&pBVar53->words +
                          (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar37) * 4);
        pcVar42 = (char *)(position + -(ulong)uVar40);
        if ((pcVar42 <= pcVar48) &&
           (pcVar39 = (char *)((long)&pBVar45->words + uVar61), pcVar39 <= ringbuffer_mask)) {
          uVar44 = (ulong)(uVar40 & uVar47);
          pcVar54 = (char *)((long)&pBVar45->words + uVar44);
          if ((pcVar54 <= ringbuffer_mask) &&
             ((ringbuffer[(long)pcVar39] == ringbuffer[(long)pcVar54] &&
              ((int)*plVar3 == *(int *)(ringbuffer + uVar44))))) {
            puVar43 = (ulong *)(ringbuffer + uVar44 + 4);
            puVar57 = (ulong *)((long)plVar3 + 4);
            puVar50 = puVar27;
            puVar38 = puVar43;
            for (puVar64 = puVar27; (undefined1 *)0x7 < puVar64; puVar64 = puVar64 + -8) {
              uVar44 = *puVar57;
              uVar18 = *puVar38;
              if (uVar44 == uVar18) {
                puVar38 = puVar38 + 1;
              }
              else {
                uVar25 = 0;
                if ((uVar18 ^ uVar44) != 0) {
                  for (; ((uVar18 ^ uVar44) >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                puVar50 = (undefined1 *)
                          ((long)puVar38 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar43));
              }
              if (uVar44 != uVar18) goto LAB_01c21c60;
              puVar57 = puVar57 + 1;
            }
            puVar55 = puVar38;
            if (puVar64 != (undefined1 *)0x0) {
              puVar55 = (ulong *)((long)puVar38 + (long)puVar64);
              puVar50 = (undefined1 *)0x0;
              do {
                if (*(char *)((long)puVar38 + (long)puVar50) !=
                    *(char *)((long)puVar57 + (long)puVar50)) {
                  puVar55 = (ulong *)((long)puVar38 + (long)puVar50);
                  break;
                }
                puVar50 = puVar50 + 1;
              } while (puVar64 != puVar50);
            }
            puVar50 = (undefined1 *)((long)puVar55 - (long)puVar43);
LAB_01c21c60:
            pBVar58 = (BrotliEncoderDictionary *)(puVar50 + 4);
            iVar41 = 0x1f;
            if ((uint)pcVar42 != 0) {
              for (; (uint)pcVar42 >> iVar41 == 0; iVar41 = iVar41 + -1) {
              }
            }
            uVar44 = (ulong)(iVar41 * -0x1e + 0x780) + (long)pBVar58 * 0x87;
            if (local_150 < uVar44) {
              pBVar45 = pBVar58;
              local_150 = uVar44;
              local_130 = pBVar58;
              local_120 = pcVar42;
            }
          }
        }
      } while (pcVar42 <= pcVar48);
      *(int *)((long)&pBVar53->words + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar8) * 4)
           = (int)position;
      *(ushort *)((long)puVar15 + uVar49 * 2) = uVar8 + 1;
      local_144 = 0;
      if ((local_150 == 0x7e4) &&
         (pHVar19 = (hasher->privat)._H6.common_,
         pHVar19->dict_num_lookups >> 7 <= pHVar19->dict_num_matches)) {
        uVar61 = (ulong)((uint)((int)*puVar32 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar20 = pBVar63->hash_table_lengths;
        sVar62 = pHVar19->dict_num_lookups;
        local_144 = 0;
        lVar33 = 0;
        do {
          sVar62 = sVar62 + 1;
          pHVar19->dict_num_lookups = sVar62;
          bVar35 = puVar20[uVar61];
          pBVar45 = (BrotliEncoderDictionary *)(ulong)bVar35;
          if (pBVar45 != (BrotliEncoderDictionary *)0x0) {
            bVar68 = true;
            if (pBVar45 <= pBVar51) {
              pBVar21 = pBVar63->words;
              puVar38 = (ulong *)(pBVar21->data +
                                 (ulong)pBVar21->offsets_by_length[(long)pBVar45] +
                                 (ulong)pBVar63->hash_table_words[uVar61] * (long)pBVar45);
              pBVar53 = pBVar45;
              puVar57 = puVar32;
              pBVar58 = (BrotliEncoderDictionary *)ringbuffer_mask;
              if (7 < bVar35) {
                do {
                  uVar66 = *puVar38;
                  uVar37 = *puVar57;
                  if (uVar66 == uVar37) {
                    puVar57 = puVar57 + 1;
                  }
                  else {
                    uVar49 = 0;
                    if ((uVar37 ^ uVar66) != 0) {
                      for (; ((uVar37 ^ uVar66) >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    pBVar58 = (BrotliEncoderDictionary *)
                              ((long)puVar57 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar32));
                  }
                  if (uVar66 != uVar37) goto LAB_01c21e2e;
                  puVar38 = puVar38 + 1;
                  pBVar53 = (BrotliEncoderDictionary *)&pBVar53[-1].words_instance_;
                } while ((BrotliDictionary **)0x7 < pBVar53);
              }
              puVar43 = puVar57;
              if (pBVar53 != (BrotliEncoderDictionary *)0x0) {
                puVar43 = (ulong *)((long)&pBVar53->words + (long)puVar57);
                lVar65 = 0;
                do {
                  if (*(char *)((long)puVar57 + lVar65) != *(char *)((long)puVar38 + lVar65)) {
                    puVar43 = (ulong *)((long)puVar57 + lVar65);
                    break;
                  }
                  lVar65 = lVar65 + 1;
                } while (pBVar53 != (BrotliEncoderDictionary *)lVar65);
              }
              pBVar58 = (BrotliEncoderDictionary *)((long)puVar43 - (long)puVar32);
LAB_01c21e2e:
              if (((pBVar58 != (BrotliEncoderDictionary *)0x0) &&
                  (pBVar45 < (BrotliEncoderDictionary *)
                             ((long)&pBVar58->words + (ulong)pBVar63->cutoffTransformsCount))) &&
                 (pcVar42 = pcVar34 + ((ulong)((uint)(pBVar63->cutoffTransforms >>
                                                     ((char)((long)pBVar45 - (long)pBVar58) * '\x06'
                                                     & 0x3fU)) & 0x3f) +
                                       ((long)pBVar45 - (long)pBVar58) * 4 <<
                                      (*(byte *)((long)&pBVar45->words + (long)pBVar21) & 0x3f)) +
                                      (ulong)pBVar63->hash_table_words[uVar61] + lVar31,
                 pcVar42 <= pcVar46)) {
                iVar41 = 0x1f;
                if ((uint)pcVar42 != 0) {
                  for (; (uint)pcVar42 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                  }
                }
                uVar66 = ((long)pBVar58 * 0x87 - (ulong)(uint)(iVar41 * 0x1e)) + 0x780;
                if (local_150 <= uVar66) {
                  local_144 = (uint)bVar35 - (int)pBVar58;
                  bVar68 = false;
                  local_150 = uVar66;
                  local_130 = pBVar58;
                  local_120 = pcVar42;
                }
              }
            }
            if (!bVar68) {
              pHVar19->dict_num_matches = pHVar19->dict_num_matches + 1;
            }
          }
          uVar61 = uVar61 + 1;
          bVar68 = lVar33 == 0;
          lVar33 = lVar33 + 1;
          pBVar53 = pBVar63;
        } while (bVar68);
      }
      if ((BrotliEncoderDictionary *)0x1f < pBVar51) {
        pcVar34 = (char *)(hasher->privat)._H35.ha_common.extra[3];
        if (pcVar34 <= position) {
          uVar40 = (hasher->privat)._H65.hb.state;
          uVar29 = (hasher->privat)._H65.hb.factor;
          uVar10 = (hasher->privat)._H65.hb.factor_remove;
          do {
            uVar56 = uVar40 & 0x3fffffff;
            bVar35 = ringbuffer[(ulong)pcVar34 & ringbuffer_mask];
            bVar7 = ringbuffer[(ulong)(pcVar34 + 0x20) & ringbuffer_mask];
            if (uVar56 < 0x1000000) {
              pvVar22 = (hasher->privat)._H35.ha_common.extra[2];
              uVar11 = *(uint *)((long)pvVar22 + (ulong)uVar56 * 4);
              *(int *)((long)pvVar22 + (ulong)uVar56 * 4) = (int)pcVar34;
              if ((pcVar34 == (char *)position) && (uVar11 != 0xffffffff)) {
                uVar56 = (int)position - uVar11;
                if ((char *)(ulong)uVar56 <= pcVar48) {
                  puVar38 = (ulong *)(ringbuffer + (uVar11 & uVar47));
                  lVar65 = 0;
                  puVar57 = puVar38;
                  lVar33 = 0;
                  do {
                    lVar67 = lVar33;
                    uVar61 = *(ulong *)((long)puVar32 + lVar65);
                    uVar66 = *puVar57;
                    if (uVar61 == uVar66) {
                      puVar57 = puVar57 + 1;
                    }
                    else {
                      uVar37 = 0;
                      if ((uVar66 ^ uVar61) != 0) {
                        for (; ((uVar66 ^ uVar61) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      pBVar53 = (BrotliEncoderDictionary *)
                                ((long)puVar57 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38));
                    }
                    if (uVar61 != uVar66) goto LAB_01c220ab;
                    lVar65 = lVar65 + 8;
                    lVar33 = lVar67 + -8;
                  } while ((char *)0x7 < (char *)((long)pBVar51 + lVar67 + -8));
                  if (pBVar51 != (BrotliEncoderDictionary *)lVar65) {
                    puVar55 = (ulong *)((long)puVar57 + ((long)pBVar51 - lVar65));
                    lVar67 = 8 - lVar67;
                    puVar43 = puVar57;
                    do {
                      puVar57 = puVar43;
                      if ((char)*puVar43 != *(char *)((long)puVar32 + lVar67)) break;
                      puVar43 = (ulong *)((long)puVar43 + 1);
                      lVar67 = lVar67 + 1;
                      puVar57 = puVar55;
                    } while (pBVar51 != (BrotliEncoderDictionary *)lVar67);
                  }
                  pBVar53 = (BrotliEncoderDictionary *)((long)puVar57 - (long)puVar38);
LAB_01c220ab:
                  if (((BrotliEncoderDictionary *)0x3 < pBVar53) && (local_130 < pBVar53)) {
                    iVar41 = 0x1f;
                    if (uVar56 != 0) {
                      for (; uVar56 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                      }
                    }
                    uVar61 = (ulong)(iVar41 * -0x1e + 0x780) + (long)pBVar53 * 0x87;
                    if (local_150 < uVar61) {
                      local_144 = 0;
                      local_150 = uVar61;
                      local_130 = pBVar53;
                      local_120 = (char *)(ulong)uVar56;
                    }
                  }
                }
              }
            }
            uVar40 = ~(uint)bVar35 * uVar10 + (uint)bVar7 + uVar40 * uVar29 + 1;
            pcVar34 = pcVar34 + 1;
          } while (pcVar34 <= position);
          (hasher->privat)._H65.hb.state = uVar40;
        }
        (hasher->privat)._H35.ha_common.extra[3] = (char *)(position + 1);
      }
      if (local_150 < 0x7e5) {
        local_138 = local_138 + 1;
        pcVar48 = (char *)(position + 1);
        if (local_d0 < pcVar48) {
          if (local_d0 + (uint)((int)lVar36 * 4) < pcVar48) {
            pcVar34 = (char *)(position + 0x11);
            if (pcVar1 <= (char *)(position + 0x11)) {
              pcVar34 = pcVar1;
            }
            if (pcVar48 < pcVar34) {
              uVar47 = (hasher->privat)._H6.block_mask_;
              uVar12 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar52 = *(long *)(ringbuffer + ((ulong)pcVar48 & ringbuffer_mask)) * uVar17 >> 0x31
                ;
                uVar8 = *(ushort *)((long)puVar15 + uVar52 * 2);
                *(ushort *)((long)puVar15 + uVar52 * 2) = uVar8 + 1;
                puVar16[(uVar52 << ((byte)uVar12 & 0x3f)) + (ulong)(uVar47 & uVar8)] =
                     (uint32_t)pcVar48;
                local_138 = local_138 + 4;
                pcVar48 = pcVar48 + 4;
              } while (pcVar48 < pcVar34);
            }
          }
          else {
            pcVar34 = (char *)(position + 9);
            if (pcVar1 <= (char *)(position + 9)) {
              pcVar34 = pcVar1;
            }
            if (pcVar48 < pcVar34) {
              uVar47 = (hasher->privat)._H6.block_mask_;
              uVar12 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar52 = *(long *)(ringbuffer + ((ulong)pcVar48 & ringbuffer_mask)) * uVar17 >> 0x31
                ;
                uVar8 = *(ushort *)((long)puVar15 + uVar52 * 2);
                *(ushort *)((long)puVar15 + uVar52 * 2) = uVar8 + 1;
                puVar16[(uVar52 << ((byte)uVar12 & 0x3f)) + (ulong)(uVar47 & uVar8)] =
                     (uint32_t)pcVar48;
                local_138 = local_138 + 2;
                pcVar48 = pcVar48 + 2;
              } while (pcVar48 < pcVar34);
            }
          }
        }
      }
      else {
        local_68 = (lVar5 + num_bytes) - position;
        local_188 = (char *)position;
        iVar41 = 0;
        do {
          pcVar48 = local_188;
          puVar27 = (undefined1 *)((long)&pBVar51[-1].words_instance_ + 7);
          pBVar63 = (BrotliEncoderDictionary *)((long)&local_130[-1].words_instance_ + 7);
          if (puVar27 <= pBVar63) {
            pBVar63 = (BrotliEncoderDictionary *)puVar27;
          }
          if (4 < params->quality) {
            pBVar63 = (BrotliEncoderDictionary *)0x0;
          }
          pcVar34 = local_188 + 1;
          pcVar42 = pcVar6;
          if (pcVar34 < pcVar6) {
            pcVar42 = pcVar34;
          }
          pcVar39 = local_188 + sVar13 + 1;
          if (pcVar6 <= local_188 + sVar13 + 1) {
            pcVar39 = pcVar6;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_b4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_c0 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_188 & ringbuffer_mask]]];
            local_c0 = (ulong)ringbuffer[(ulong)local_188 & ringbuffer_mask];
          }
          pBVar45 = (params->dictionary).contextual.dict[local_b4];
          uVar61 = (ulong)pcVar34 & ringbuffer_mask;
          uVar66 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
          if (uVar66 == 0) {
            local_180 = 0x7e4;
            local_108 = (char *)0x0;
            local_158 = (BrotliEncoderDictionary *)0x0;
          }
          else {
            local_180 = 0x7e4;
            uVar37 = 0;
            local_158 = (BrotliEncoderDictionary *)0x0;
            local_108 = (char *)0x0;
            do {
              pcVar54 = (char *)(long)dist_cache[uVar37];
              if (((pcVar54 <= pcVar42) && (pcVar34 + -(long)pcVar54 < pcVar34)) &&
                 (pcVar59 = (char *)((long)&pBVar63->words + uVar61), pcVar59 <= ringbuffer_mask)) {
                uVar49 = (ulong)(pcVar34 + -(long)pcVar54) & ringbuffer_mask;
                pBVar53 = (BrotliEncoderDictionary *)((long)&pBVar63->words + uVar49);
                if ((pBVar53 <= ringbuffer_mask) &&
                   (ringbuffer[(long)pcVar59] == ringbuffer[(long)pBVar53])) {
                  puVar38 = (ulong *)(ringbuffer + uVar49);
                  puVar32 = (ulong *)(ringbuffer + uVar61);
                  puVar57 = puVar38;
                  for (puVar64 = puVar27; (undefined1 *)0x7 < puVar64; puVar64 = puVar64 + -8) {
                    uVar49 = *puVar32;
                    uVar44 = *puVar57;
                    if (uVar49 == uVar44) {
                      puVar57 = puVar57 + 1;
                    }
                    else {
                      uVar18 = 0;
                      if ((uVar44 ^ uVar49) != 0) {
                        for (; ((uVar44 ^ uVar49) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      pBVar53 = (BrotliEncoderDictionary *)
                                ((long)puVar57 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar38));
                    }
                    if (uVar49 != uVar44) goto LAB_01c2234d;
                    puVar32 = puVar32 + 1;
                  }
                  puVar43 = puVar57;
                  if (puVar64 != (undefined1 *)0x0) {
                    puVar43 = (ulong *)((long)puVar57 + (long)puVar64);
                    lVar33 = 0;
                    do {
                      if (*(char *)((long)puVar57 + lVar33) != *(char *)((long)puVar32 + lVar33)) {
                        puVar43 = (ulong *)((long)puVar57 + lVar33);
                        break;
                      }
                      lVar33 = lVar33 + 1;
                    } while (puVar64 != (undefined1 *)lVar33);
                  }
                  pBVar53 = (BrotliEncoderDictionary *)((long)puVar43 - (long)puVar38);
LAB_01c2234d:
                  if ((((BrotliEncoderDictionary *)0x2 < pBVar53) ||
                      ((uVar37 < 2 && (pBVar53 == (BrotliEncoderDictionary *)0x2)))) &&
                     (uVar49 = (long)pBVar53 * 0x87 + 0x78f, local_180 < uVar49)) {
                    if (uVar37 != 0) {
                      uVar49 = uVar49 - ((0x1ca10U >> ((byte)uVar37 & 0xe) & 0xe) + 0x27);
                    }
                    if (local_180 < uVar49) {
                      pBVar63 = pBVar53;
                      local_180 = uVar49;
                      local_158 = pBVar53;
                      local_108 = pcVar54;
                    }
                  }
                }
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar66);
          }
          plVar3 = (long *)(ringbuffer + uVar61);
          uVar49 = *plVar3 * uVar17 >> 0x31;
          lVar33 = uVar49 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
          puVar32 = (ulong *)(ringbuffer + uVar61);
          uVar8 = *(ushort *)((long)puVar15 + uVar49 * 2);
          uVar37 = (ulong)uVar8;
          uVar66 = 0;
          if (uVar52 <= uVar37) {
            uVar66 = uVar37 - uVar52;
          }
          puVar57 = (ulong *)((long)plVar3 + 4);
          do {
            if (uVar37 <= uVar66) break;
            uVar37 = uVar37 - 1;
            pcVar54 = pcVar34 + -(ulong)puVar16[lVar33 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                                (uint)uVar37)];
            if ((pcVar54 <= pcVar42) &&
               (pcVar59 = (char *)((long)&pBVar63->words + uVar61), pcVar59 <= ringbuffer_mask)) {
              uVar44 = (ulong)(puVar16[lVar33 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                       (uint)uVar37)] & uVar47);
              pcVar4 = (char *)((long)&pBVar63->words + uVar44);
              if ((pcVar4 <= ringbuffer_mask) &&
                 ((ringbuffer[(long)pcVar59] == ringbuffer[(long)pcVar4] &&
                  ((int)*plVar3 == *(int *)(ringbuffer + uVar44))))) {
                puVar55 = (ulong *)(ringbuffer + uVar44 + 4);
                puVar38 = (ulong *)((long)plVar3 + 4);
                puVar43 = puVar55;
                for (puVar64 = (undefined1 *)((long)&pBVar51[-1].words_instance_ + 3);
                    (undefined1 *)0x7 < puVar64; puVar64 = puVar64 + -8) {
                  uVar44 = *puVar38;
                  uVar18 = *puVar43;
                  if (uVar44 == uVar18) {
                    puVar43 = puVar43 + 1;
                  }
                  else {
                    uVar25 = 0;
                    if ((uVar18 ^ uVar44) != 0) {
                      for (; ((uVar18 ^ uVar44) >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    puVar57 = (ulong *)((long)puVar43 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar55)
                                       );
                  }
                  if (uVar44 != uVar18) goto LAB_01c2255f;
                  puVar38 = puVar38 + 1;
                }
                puVar57 = puVar43;
                if (puVar64 != (undefined1 *)0x0) {
                  puVar57 = (ulong *)((long)puVar43 + (long)puVar64);
                  puVar50 = (undefined1 *)0x0;
                  do {
                    if (*(char *)((long)puVar43 + (long)puVar50) != puVar50[(long)puVar38]) {
                      puVar57 = (ulong *)((long)puVar43 + (long)puVar50);
                      break;
                    }
                    puVar50 = puVar50 + 1;
                  } while (puVar64 != puVar50);
                }
                puVar57 = (ulong *)((long)puVar57 - (long)puVar55);
LAB_01c2255f:
                puVar57 = (ulong *)((long)puVar57 + 4);
                iVar60 = 0x1f;
                if ((uint)pcVar54 != 0) {
                  for (; (uint)pcVar54 >> iVar60 == 0; iVar60 = iVar60 + -1) {
                  }
                }
                uVar44 = (ulong)(iVar60 * -0x1e + 0x780) + (long)puVar57 * 0x87;
                if (local_180 < uVar44) {
                  pBVar63 = (BrotliEncoderDictionary *)puVar57;
                  local_180 = uVar44;
                  local_158 = (BrotliEncoderDictionary *)puVar57;
                  local_108 = pcVar54;
                }
              }
            }
          } while (pcVar54 <= pcVar42);
          puVar16[lVar33 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar8)] =
               (uint32_t)pcVar34;
          uVar40 = uVar8 + 1;
          pBVar51 = (BrotliEncoderDictionary *)(ulong)uVar40;
          *(short *)((long)puVar15 + uVar49 * 2) = (short)uVar40;
          if (local_180 == 0x7e4) {
            pHVar19 = (hasher->privat)._H6.common_;
            if (pHVar19->dict_num_matches < pHVar19->dict_num_lookups >> 7) {
              local_110 = 0;
            }
            else {
              pBVar63 = (BrotliEncoderDictionary *)
                        (ulong)((uint)((int)*puVar32 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar20 = pBVar45->hash_table_lengths;
              sVar62 = pHVar19->dict_num_lookups;
              local_110 = 0;
              lVar33 = 0;
              do {
                sVar62 = sVar62 + 1;
                pHVar19->dict_num_lookups = sVar62;
                bVar35 = puVar20[(long)pBVar63];
                pcVar54 = (char *)(ulong)bVar35;
                if (pcVar54 != (char *)0x0) {
                  bVar68 = true;
                  if (pcVar54 <= puVar27) {
                    pBVar21 = pBVar45->words;
                    puVar38 = (ulong *)(pBVar21->data +
                                       (ulong)pBVar21->offsets_by_length[(long)pcVar54] +
                                       (ulong)pBVar45->hash_table_words[(long)pBVar63] *
                                       (long)pcVar54);
                    puVar57 = puVar32;
                    pcVar59 = pcVar54;
                    if (7 < bVar35) {
                      do {
                        uVar61 = *puVar38;
                        uVar66 = *puVar57;
                        if (uVar61 == uVar66) {
                          puVar57 = puVar57 + 1;
                        }
                        else {
                          uVar37 = 0;
                          if ((uVar66 ^ uVar61) != 0) {
                            for (; ((uVar66 ^ uVar61) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                            }
                          }
                          pBVar51 = (BrotliEncoderDictionary *)
                                    ((long)puVar57 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar32));
                        }
                        if (uVar61 != uVar66) goto LAB_01c22771;
                        puVar38 = puVar38 + 1;
                        pcVar59 = pcVar59 + -8;
                      } while ((char *)0x7 < pcVar59);
                    }
                    puVar43 = puVar57;
                    if (pcVar59 != (char *)0x0) {
                      puVar43 = (ulong *)((long)puVar57 + (long)pcVar59);
                      lVar65 = 0;
                      do {
                        if (*(char *)((long)puVar57 + lVar65) != *(char *)((long)puVar38 + lVar65))
                        {
                          puVar43 = (ulong *)((long)puVar57 + lVar65);
                          break;
                        }
                        lVar65 = lVar65 + 1;
                      } while (pcVar59 != (char *)lVar65);
                    }
                    pBVar51 = (BrotliEncoderDictionary *)((long)puVar43 - (long)puVar32);
LAB_01c22771:
                    if (((pBVar51 != (BrotliEncoderDictionary *)0x0) &&
                        (pcVar54 < (char *)((long)&pBVar51->words +
                                           (ulong)pBVar45->cutoffTransformsCount))) &&
                       (pcVar54 = pcVar39 + ((ulong)((uint)(pBVar45->cutoffTransforms >>
                                                           ((char)((long)pcVar54 - (long)pBVar51) *
                                                            '\x06' & 0x3fU)) & 0x3f) +
                                             ((long)pcVar54 - (long)pBVar51) * 4 <<
                                            (pcVar54[(long)pBVar21] & 0x3fU)) +
                                            (ulong)pBVar45->hash_table_words[(long)pBVar63] + lVar31
                       , pcVar54 <= pcVar46)) {
                      iVar60 = 0x1f;
                      if ((uint)pcVar54 != 0) {
                        for (; (uint)pcVar54 >> iVar60 == 0; iVar60 = iVar60 + -1) {
                        }
                      }
                      uVar61 = ((long)pBVar51 * 0x87 - (ulong)(uint)(iVar60 * 0x1e)) + 0x780;
                      if (local_180 <= uVar61) {
                        local_110 = (uint)bVar35 - (int)pBVar51;
                        bVar68 = false;
                        local_180 = uVar61;
                        local_158 = pBVar51;
                        local_108 = pcVar54;
                      }
                    }
                  }
                  if (!bVar68) {
                    pHVar19->dict_num_matches = pHVar19->dict_num_matches + 1;
                  }
                }
                pBVar63 = (BrotliEncoderDictionary *)((long)pBVar63 + 1);
                bVar68 = lVar33 == 0;
                lVar33 = lVar33 + 1;
              } while (bVar68);
            }
          }
          else {
            local_110 = 0;
          }
          if ((undefined1 *)0x1f < puVar27) {
            pcVar39 = (char *)(hasher->privat)._H35.ha_common.extra[3];
            if (pcVar39 <= pcVar34) {
              uVar40 = (hasher->privat)._H65.hb.state;
              uVar29 = (hasher->privat)._H65.hb.factor;
              uVar10 = (hasher->privat)._H65.hb.factor_remove;
              do {
                uVar56 = uVar40 & 0x3fffffff;
                bVar35 = ringbuffer[(ulong)pcVar39 & ringbuffer_mask];
                bVar7 = ringbuffer[(ulong)(pcVar39 + 0x20) & ringbuffer_mask];
                if (uVar56 < 0x1000000) {
                  pvVar22 = (hasher->privat)._H35.ha_common.extra[2];
                  uVar11 = *(uint *)((long)pvVar22 + (ulong)uVar56 * 4);
                  *(int *)((long)pvVar22 + (ulong)uVar56 * 4) = (int)pcVar39;
                  if ((pcVar39 == pcVar34) && (uVar11 != 0xffffffff)) {
                    uVar56 = (uint32_t)pcVar34 - uVar11;
                    if ((char *)(ulong)uVar56 <= pcVar42) {
                      puVar38 = (ulong *)(ringbuffer + (uVar11 & uVar47));
                      lVar33 = 0;
                      lVar65 = 0;
                      puVar57 = puVar38;
                      do {
                        uVar61 = *(ulong *)((long)puVar32 + lVar65);
                        uVar66 = *puVar57;
                        if (uVar61 == uVar66) {
                          puVar57 = puVar57 + 1;
                        }
                        else {
                          uVar37 = 0;
                          if ((uVar66 ^ uVar61) != 0) {
                            for (; ((uVar66 ^ uVar61) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                            }
                          }
                          pBVar63 = (BrotliEncoderDictionary *)
                                    ((long)puVar57 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38));
                        }
                        if (uVar61 != uVar66) goto LAB_01c22971;
                        lVar65 = lVar65 + 8;
                        lVar67 = local_68 + lVar33;
                        lVar33 = lVar33 + -8;
                      } while (7 < lVar67 - 8U);
                      if (lVar65 != local_68) {
                        pcVar54 = (char *)((long)puVar32 + lVar65);
                        lVar33 = lVar33 + local_68;
                        puVar55 = (ulong *)((long)puVar57 + (local_68 - lVar65));
                        puVar43 = puVar57;
                        do {
                          puVar57 = puVar43;
                          if ((char)*puVar43 != *pcVar54) break;
                          pcVar54 = pcVar54 + 1;
                          puVar43 = (ulong *)((long)puVar43 + 1);
                          lVar33 = lVar33 + -1;
                          puVar57 = puVar55;
                        } while (lVar33 != 0);
                      }
                      pBVar63 = (BrotliEncoderDictionary *)((long)puVar57 - (long)puVar38);
LAB_01c22971:
                      if (((BrotliEncoderDictionary *)0x3 < pBVar63) && (local_158 < pBVar63)) {
                        iVar60 = 0x1f;
                        if (uVar56 != 0) {
                          for (; uVar56 >> iVar60 == 0; iVar60 = iVar60 + -1) {
                          }
                        }
                        uVar61 = (ulong)(iVar60 * -0x1e + 0x780) + (long)pBVar63 * 0x87;
                        if (local_180 < uVar61) {
                          local_110 = 0;
                          local_180 = uVar61;
                          local_158 = pBVar63;
                          local_108 = (char *)(ulong)uVar56;
                        }
                      }
                    }
                  }
                }
                uVar40 = ~(uint)bVar35 * uVar10 + (uint)bVar7 + uVar40 * uVar29 + 1;
                pcVar39 = pcVar39 + 1;
              } while (pcVar39 <= pcVar34);
              (hasher->privat)._H65.hb.state = uVar40;
            }
            (hasher->privat)._H35.ha_common.extra[3] = local_188 + 2;
          }
          bVar68 = local_150 + 0xaf <= local_180;
          iVar60 = iVar41;
          if (bVar68) {
            local_138 = local_138 + 1;
            local_150 = local_180;
            local_120 = local_108;
            local_130 = local_158;
            local_188 = pcVar34;
            local_144 = local_110;
            iVar60 = iVar41 + 1;
          }
          bVar24 = iVar41 < 3;
          local_68 = local_68 + -1;
          pBVar51 = (BrotliEncoderDictionary *)puVar27;
          iVar41 = iVar60;
        } while (bVar68 && (bVar24 && pcVar48 + 9 < pcVar2));
        pcVar48 = local_188 + sVar13;
        if (pcVar6 <= local_188 + sVar13) {
          pcVar48 = pcVar6;
        }
        if (pcVar48 + sVar14 < local_120) {
LAB_01c22c45:
          pcVar34 = local_120 + 0xf;
        }
        else {
          uVar47 = 0;
          bVar68 = false;
          if (local_120 != (char *)(long)*dist_cache) {
            if (local_120 == (char *)(long)dist_cache[1]) {
              uVar47 = 1;
            }
            else {
              if (local_120 + (3 - (long)*dist_cache) < (char *)0x7) {
                bVar35 = (byte)((int)(local_120 + (3 - (long)*dist_cache)) << 2);
                uVar47 = 0x9750468;
              }
              else {
                if ((char *)0x6 < local_120 + (3 - (long)dist_cache[1])) {
                  if (local_120 != (char *)(long)dist_cache[2]) {
                    bVar68 = local_120 != (char *)(long)dist_cache[3];
                    uVar47 = 3;
                    goto LAB_01c22c41;
                  }
                  uVar47 = 2;
                  goto LAB_01c22c3f;
                }
                bVar35 = (byte)((int)(local_120 + (3 - (long)dist_cache[1])) << 2);
                uVar47 = 0xfdb1ace;
              }
              uVar47 = uVar47 >> (bVar35 & 0x1f) & 0xf;
            }
LAB_01c22c3f:
            bVar68 = false;
          }
LAB_01c22c41:
          if (bVar68) goto LAB_01c22c45;
          pcVar34 = (char *)(ulong)uVar47;
        }
        if ((local_120 <= pcVar48 + sVar14) && (pcVar34 != (char *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar23 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar23;
          iVar60 = (int)local_120;
          *dist_cache = iVar60;
          iVar41 = (hasher->privat)._H6.num_last_distances_to_check_;
          if (4 < iVar41) {
            dist_cache[4] = iVar60 + -1;
            dist_cache[5] = iVar60 + 1;
            dist_cache[6] = iVar60 + -2;
            dist_cache[7] = iVar60 + 2;
            dist_cache[8] = iVar60 + -3;
            dist_cache[9] = iVar60 + 3;
            if (10 < iVar41) {
              iVar41 = (int)uVar23;
              dist_cache[10] = iVar41 + -1;
              dist_cache[0xb] = iVar41 + 1;
              dist_cache[0xc] = iVar41 + -2;
              dist_cache[0xd] = iVar41 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar41 + 3,iVar41 + -3);
            }
          }
        }
        uVar47 = (uint)local_138;
        local_e0->insert_len_ = uVar47;
        local_e0->copy_len_ = local_144 << 0x19 | (uint)local_130;
        uVar52 = (ulong)(params->dist).num_direct_distance_codes;
        pcVar48 = (char *)(uVar52 + 0x10);
        if (pcVar34 < pcVar48) {
          local_e0->dist_prefix_ = (uint16_t)pcVar34;
          uVar29 = 0;
        }
        else {
          uVar29 = (params->dist).distance_postfix_bits;
          bVar35 = (byte)uVar29;
          pcVar34 = pcVar34 + ((4L << (bVar35 & 0x3f)) - uVar52) + -0x10;
          uVar40 = 0x1f;
          if ((uint)pcVar34 != 0) {
            for (; (uint)pcVar34 >> uVar40 == 0; uVar40 = uVar40 - 1) {
            }
          }
          uVar40 = (uVar40 ^ 0xffffffe0) + 0x1f;
          bVar68 = ((ulong)pcVar34 >> ((ulong)uVar40 & 0x3f) & 1) != 0;
          iVar41 = uVar40 - uVar29;
          local_e0->dist_prefix_ =
               (short)((uint)bVar68 + iVar41 * 2 + 0xfffe << (bVar35 & 0x3f)) +
               (short)pcVar48 + (~(ushort)(-1 << (bVar35 & 0x1f)) & (ushort)pcVar34) |
               (short)iVar41 * 0x400;
          uVar29 = (uint32_t)
                   ((long)pcVar34 - ((ulong)bVar68 + 2 << ((byte)uVar40 & 0x3f)) >> (bVar35 & 0x3f))
          ;
        }
        local_e0->dist_extra_ = uVar29;
        if (5 < local_138) {
          if (local_138 < 0x82) {
            uVar47 = 0x1f;
            uVar40 = (uint)(local_138 - 2);
            if (uVar40 != 0) {
              for (; uVar40 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar47 = (int)(local_138 - 2 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar47 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_138 < 0x842) {
            uVar40 = 0x1f;
            if (uVar47 - 0x42 != 0) {
              for (; uVar47 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar47 = (uVar40 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar47 = 0x15;
            if (0x1841 < local_138) {
              uVar47 = (uint)(ushort)(0x17 - (local_138 < 0x5842));
            }
          }
        }
        uVar40 = local_144 + (uint)local_130;
        if (uVar40 < 10) {
          uVar56 = uVar40 - 2;
        }
        else if (uVar40 < 0x86) {
          uVar40 = uVar40 - 6;
          uVar56 = 0x1f;
          if (uVar40 != 0) {
            for (; uVar40 >> uVar56 == 0; uVar56 = uVar56 - 1) {
            }
          }
          uVar56 = (int)((ulong)(long)(int)uVar40 >> ((char)(uVar56 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar56 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar56 = 0x17;
          if (uVar40 < 0x846) {
            uVar56 = 0x1f;
            if (uVar40 - 0x46 != 0) {
              for (; uVar40 - 0x46 >> uVar56 == 0; uVar56 = uVar56 - 1) {
              }
            }
            uVar56 = (uVar56 ^ 0xffe0) + 0x2c;
          }
        }
        uVar8 = (ushort)uVar56;
        uVar28 = (uVar8 & 7) + ((ushort)uVar47 & 7) * 8;
        if ((((local_e0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar47 < 8)) && (uVar8 < 0x10)) {
          if (7 < uVar8) {
            uVar28 = uVar28 | 0x40;
          }
        }
        else {
          iVar41 = ((uVar47 & 0xffff) >> 3) * 3 + ((uVar56 & 0xffff) >> 3);
          uVar28 = uVar28 + ((ushort)(0x520d40 >> ((char)iVar41 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar41 * 0x40 + 0x40;
        }
        local_e0->cmd_prefix_ = uVar28;
        *num_literals = *num_literals + local_138;
        pcVar48 = local_188 + (long)&local_130->words;
        pcVar34 = pcVar30;
        if (pcVar48 < pcVar30) {
          pcVar34 = pcVar48;
        }
        pcVar46 = local_188 + 2;
        if (local_120 < (char *)((ulong)local_130 >> 2)) {
          pcVar42 = pcVar48 + (long)local_120 * -4;
          if (pcVar48 + (long)local_120 * -4 < pcVar46) {
            pcVar42 = pcVar46;
          }
          pcVar46 = pcVar42;
          if (pcVar34 < pcVar42) {
            pcVar46 = pcVar34;
          }
        }
        local_d0 = local_188 + lVar36 + (long)local_130 * 2;
        local_e0 = local_e0 + 1;
        if (pcVar46 < pcVar34) {
          uVar17 = (hasher->privat)._H6.hash_mul_;
          uVar47 = (hasher->privat)._H6.block_mask_;
          uVar12 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar52 = *(long *)(ringbuffer + ((ulong)pcVar46 & ringbuffer_mask)) * uVar17 >> 0x31;
            uVar8 = *(ushort *)((long)puVar15 + uVar52 * 2);
            *(ushort *)((long)puVar15 + uVar52 * 2) = uVar8 + 1;
            puVar16[(uVar52 << ((byte)uVar12 & 0x3f)) + (ulong)(uVar47 & uVar8)] = (uint32_t)pcVar46
            ;
            pcVar46 = pcVar46 + 1;
          } while (pcVar34 != pcVar46);
        }
        local_138 = 0;
      }
      position = (size_t)pcVar48;
    } while ((char *)(position + 8) < pcVar2);
  }
  else {
    local_e0 = commands;
  }
  *last_insert_len = (size_t)(pcVar2 + (local_138 - position));
  *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}